

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O2

void __thiscall
QPDFSystemError::QPDFSystemError(QPDFSystemError *this,string *description,int system_errno)

{
  string local_40;
  
  createWhat(&local_40,description,system_errno);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__QPDFSystemError_002b0118;
  std::__cxx11::string::string((string *)&this->description,(string *)description);
  this->system_errno = system_errno;
  return;
}

Assistant:

QPDFSystemError::QPDFSystemError(std::string const& description, int system_errno) :
    std::runtime_error(createWhat(description, system_errno)),
    description(description),
    system_errno(system_errno)
{
}